

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O1

void anon_unknown.dwarf_b841::testDenormalizedRounding(int n)

{
  ushort uVar1;
  uint uVar2;
  ostream *poVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rounding denormalized numbers to ",0x21);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-bit precision\n",0xf);
  local_50 = 0.0;
  if (n < 10) {
    local_50 = (float)(double)(((ulong)(10 - n) << 0x34) + 0x3e600000001c5f68);
  }
  iVar6 = 200000;
  uVar5 = 0;
  fVar9 = 0.0;
  while( true ) {
    fVar10 = drand();
    fVar10 = fVar10 * 6.097555e-05;
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      uVar1 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar10 >> 0x17) * 2);
      if (uVar1 == 0) {
        uVar2 = half::convert((int)fVar10);
      }
      else {
        uVar2 = (uint)uVar1 +
                (((uint)fVar10 & 0x7fffff) + 0xfff + (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd);
      }
    }
    else {
      uVar2 = (uint)fVar10 >> 0x10;
    }
    uVar7 = uVar2 ^ uVar5;
    uVar8 = uVar7;
    if ((uint)n < 10) {
      bVar4 = (byte)(9U - n);
      uVar2 = ((uVar2 & 0x7fff) >> (bVar4 & 0x1f)) +
              (uint)(((uVar2 & 0x7fff) >> (9U - n & 0x1f) & 1) != 0) << (bVar4 & 0x1f);
      uVar8 = uVar7 & -1 << (10U - (char)n & 0x1f);
      if ((uVar2 & 0xfc00) < 0x7c00) {
        uVar8 = uVar2;
      }
      uVar8 = uVar8 | uVar7 & 0xffff8000;
    }
    fVar11 = *(float *)((long)&half::_toFloat + (ulong)(uVar8 & 0xffff) * 4) -
             *(float *)((long)&half::_toFloat + (ulong)(uVar7 & 0xffff) * 4);
    fVar10 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar10 = fVar11;
    }
    if (local_50 < fVar10) break;
    if (fVar10 <= fVar9) {
      fVar10 = fVar9;
    }
    uVar5 = uVar5 - 0x8000;
    iVar6 = iVar6 + -1;
    fVar9 = fVar10;
    if (iVar6 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max error          = ",0x15);
      poVar3 = std::ostream::_M_insert<double>((double)fVar10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max expected error = ",0x15);
      poVar3 = std::ostream::_M_insert<double>((double)local_50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n\n",4);
      std::ostream::flush();
      return;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"half = ");
  poVar3 = (ostream *)operator<<(poVar3,(half)(unsigned_short)uVar7);
  poVar3 = std::operator<<(poVar3,", rounded = ");
  poVar3 = (ostream *)operator<<(poVar3,(half)(unsigned_short)uVar8);
  poVar3 = std::operator<<(poVar3,", error = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar10);
  poVar3 = std::operator<<(poVar3,", expected error = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_50);
  std::endl<char,std::char_traits<char>>(poVar3);
  printBits((ostream *)&std::cout,(half)(unsigned_short)uVar7);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  printBits((ostream *)&std::cout,(half)(unsigned_short)uVar8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testError.cpp"
                ,0xc6,"void (anonymous namespace)::testDenormalizedRounding(int)");
}

Assistant:

void
testDenormalizedRounding (int n)
{
    cout << "rounding denormalized numbers to " << n << "-bit precision\n";

    float eExpected = (n < 10)? HALF_MIN * 0.5f * (1 << (10 - n)): 0;
    float eMax = 0;

    for (int i = 0; i < 200000; i++)
    {
	half h (drand() * (HALF_NRM_MIN - HALF_MIN));

	if (i & 1)
	    h = -h;

	half r (h.round(n));
	float e = r - h;

	if (e < 0)
	    e = -e;

	if (e > eExpected)
	{
	    cout << "half = " << h <<
		    ", rounded = " << r <<
		    ", error = " << e <<
		    ", expected error = " << eExpected << endl;

	    printBits (cout, h);
	    cout << endl;
	    printBits (cout, r);
	    cout << endl;

	    assert (false);
	}

	if (e > eMax)
	    eMax = e;
    }

    cout << "max error          = " << eMax << endl;
    cout << "max expected error = " << eExpected << endl;
    cout << "ok\n\n" << flush;
}